

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

Upvalue * __thiscall luna::GC::NewUpvalue(GC *this,GCGeneration gen)

{
  Upvalue *obj;
  undefined4 in_ESI;
  Upvalue *u;
  undefined4 in_stack_ffffffffffffffe0;
  GCGeneration in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  obj = (Upvalue *)operator_new(0x28);
  Upvalue::Upvalue((Upvalue *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  (obj->super_GCObject).field_0x10 = (obj->super_GCObject).field_0x10 & 0xf | 0x40;
  SetObjectGen((GC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(GCObject *)obj,
               in_stack_ffffffffffffffe4);
  return obj;
}

Assistant:

Upvalue * GC::NewUpvalue(GCGeneration gen)
    {
        auto u = new Upvalue;
        u->gc_obj_type_ = GCObjectType_Upvalue;
        SetObjectGen(u, gen);
        return u;
    }